

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::IntrusiveListIteratorTest::
TestBackward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
          (IntrusiveListIteratorTest *this,
          reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
          *first,reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
                 *last,vector<int,_std::allocator<int>_> *expected)

{
  intrusive_list<(anonymous_namespace)::TestObject> *piVar1;
  bool bVar2;
  pointer pTVar3;
  int line;
  unsigned_long uVar4;
  long lVar5;
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  unsigned_long local_38;
  
  lVar5 = 0;
  uVar4 = 0;
  do {
    local_38 = uVar4;
    bVar2 = std::operator!=((reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
                             *)this,first);
    if (!bVar2) {
      local_58.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)(last->current).node_ - (long)(last->current).list_ >> 2);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"count","expected.size()",&local_38,
                 (unsigned_long *)&local_58);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_58);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        line = 0xb1;
LAB_001f535e:
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-intrusive-list.cc"
                   ,line,message);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_58);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      return;
    }
    wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator::operator++
              (&first->current);
    piVar1 = (last->current).list_;
    pTVar3 = std::
             reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
             ::operator->(first);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"expected[count]","last->data",
               (int *)((long)&piVar1->first_ + lVar5),&pTVar3->data);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_58);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      line = 0xae;
      goto LAB_001f535e;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 4;
  } while( true );
}

Assistant:

void TestBackward(Iter first, Iter last, const std::vector<int>& expected) {
    size_t count = 0;
    while (first != last) {
      --last;
      ASSERT_EQ(expected[count], last->data);
      ++count;
    }
    ASSERT_EQ(count, expected.size());
  }